

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>::duplicate
          (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::deque<cs_impl::any,std::allocator<cs_impl::any>>&>
                     ((allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>,64ul,cs_impl::default_allocator_provider>
                       *)holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>::allocator,
                      &this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}